

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fftsad(fitsfile *mfptr,HDUtracker *HDU,int *newPosition,char *newFileName)

{
  int iVar1;
  void *pvVar2;
  char *in_RCX;
  int *in_RDX;
  int *in_RSI;
  fitsfile *in_RDI;
  bool bVar3;
  char filename2 [1025];
  char filename1 [1025];
  int status;
  int hdunum;
  int i;
  char *in_stack_fffffffffffff7a8;
  undefined6 in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7b6;
  undefined1 in_stack_fffffffffffff7b7;
  char local_848 [1104];
  int *in_stack_fffffffffffffc08;
  char *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  int *local_18;
  int *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ffghdn(in_RDI,&local_28);
  ffflnm((fitsfile *)
         CONCAT17(in_stack_fffffffffffff7b7,
                  CONCAT16(in_stack_fffffffffffff7b6,in_stack_fffffffffffff7b0)),
         in_stack_fffffffffffff7a8,(int *)0x1d47e4);
  local_2c = ffrtnm(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  local_24 = 0;
  while( true ) {
    bVar3 = false;
    if (local_24 < *local_10) {
      bVar3 = false;
      if (local_10[(long)local_24 + 0x7d2] == local_28) {
        iVar1 = strcmp(*(char **)(local_10 + (long)local_24 * 2 + 2),local_848);
        bVar3 = iVar1 == 0;
      }
      bVar3 = (bool)(bVar3 ^ 1);
    }
    if (!bVar3) break;
    local_24 = local_24 + 1;
  }
  if (local_24 == *local_10) {
    if (*local_10 == 1000) {
      local_2c = 0x159;
    }
    else {
      pvVar2 = malloc(0x401);
      *(void **)(local_10 + (long)local_24 * 2 + 2) = pvVar2;
      if (*(long *)(local_10 + (long)local_24 * 2 + 2) == 0) {
        local_2c = 0x71;
      }
      else {
        pvVar2 = malloc(0x401);
        *(void **)(local_10 + (long)local_24 * 2 + 0xbba) = pvVar2;
        if (*(long *)(local_10 + (long)local_24 * 2 + 0xbba) == 0) {
          local_2c = 0x71;
          free(*(void **)(local_10 + (long)local_24 * 2 + 2));
        }
        else {
          local_10[(long)local_24 + 0x7d2] = local_28;
          local_10[(long)local_24 + 0x138a] = local_28;
          strcpy(*(char **)(local_10 + (long)local_24 * 2 + 2),local_848);
          strcpy(*(char **)(local_10 + (long)local_24 * 2 + 0xbba),local_848);
          *local_10 = *local_10 + 1;
        }
      }
    }
  }
  else {
    local_2c = 0x15a;
    if (local_18 != (int *)0x0) {
      *local_18 = local_10[(long)local_24 + 0x138a];
    }
    if (local_20 != (char *)0x0) {
      strcpy(local_20,*(char **)(local_10 + (long)local_24 * 2 + 0xbba));
    }
  }
  return local_2c;
}

Assistant:

int fftsad(fitsfile   *mfptr,       /* pointer to an member HDU             */
	   HDUtracker *HDU,         /* pointer to an HDU tracker struct     */
	   int        *newPosition, /* new HDU position of the member HDU   */
	   char       *newFileName) /* file containing member HDU           */

/*
  add an HDU to the HDUtracker struct pointed to by HDU. The HDU is only 
  added if it does not already reside in the HDUtracker. If it already
  resides in the HDUtracker then the new HDU postion and file name are
  returned in  newPosition and newFileName (if != NULL)
*/

{
  int i;
  int hdunum;
  int status = 0;

  char filename1[FLEN_FILENAME];
  char filename2[FLEN_FILENAME];

  do
    {
      /* retrieve the HDU's position within the FITS file */

      fits_get_hdu_num(mfptr,&hdunum);
      
      /* retrieve the HDU's file name */
      
      status = fits_file_name(mfptr,filename1,&status);
      
      /* parse the file name and construct the "standard" URL for it */
      
      status = ffrtnm(filename1,filename2,&status);
      
      /* 
	 examine all the existing HDUs in the HDUtracker an see if this HDU
	 has already been registered
      */

      for(i = 0; 
       i < HDU->nHDU &&  !(HDU->position[i] == hdunum 
			   && strcmp(HDU->filename[i],filename2) == 0);
	  ++i);

      if(i != HDU->nHDU) 
	{
	  status = HDU_ALREADY_TRACKED;
	  if(newPosition != NULL) *newPosition = HDU->newPosition[i];
	  if(newFileName != NULL) strcpy(newFileName,HDU->newFilename[i]);
	  continue;
	}

      if(HDU->nHDU == MAX_HDU_TRACKER) 
	{
	  status = TOO_MANY_HDUS_TRACKED;
	  continue;
	}

      HDU->filename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->filename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  continue;
	}

      HDU->newFilename[i] = (char*) malloc(FLEN_FILENAME * sizeof(char));

      if(HDU->newFilename[i] == NULL)
	{
	  status = MEMORY_ALLOCATION;
	  free(HDU->filename[i]);
	  continue;
	}

      HDU->position[i]    = hdunum;
      HDU->newPosition[i] = hdunum;

      strcpy(HDU->filename[i],filename2);
      strcpy(HDU->newFilename[i],filename2);
 
       ++(HDU->nHDU);

    }while(0);

  return(status);
}